

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::visit_(IDLExportVisitor *this,OpaqueType *type)

{
  UnsupportedType *this_00;
  allocator local_39;
  string local_38;
  
  if (this->m_exporter->m_opaque_as_any == true) {
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string
            ((string *)&local_38,"opaque types are not supported for export in IDL",&local_39);
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_38);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLExportVisitor::visit_(OpaqueType const& type)
    {
        if (m_exporter.marshalOpaquesAsAny())
            return true;

        throw UnsupportedType(type, "opaque types are not supported for export in IDL");
    }